

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

char * cht_Morph(player_t *player,PClassPlayerPawn *morphclass,bool quickundo)

{
  APlayerPawn *pAVar1;
  PClassPlayerPawn *pPVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  
  pAVar1 = player->mo;
  if (pAVar1 == (APlayerPawn *)0x0) {
    return (char *)"";
  }
  if ((pAVar1->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar1);
    (pAVar1->super_AActor).super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar4);
  }
  iVar4 = (uint)(gameinfo.gametype == GAME_Hexen) * 8 + 4;
  if (player->morphTics == 0) {
    bVar3 = P_MorphPlayer(player,player,morphclass,0,iVar4,(PClassActor *)0x0,(PClassActor *)0x0);
    if (!bVar3) {
      return (char *)"";
    }
    pcVar5 = "TXT_STRANGE";
  }
  else {
    pPVar2 = (PClassPlayerPawn *)(pAVar1->super_AActor).super_DThinker.super_DObject.Class;
    bVar3 = P_UndoPlayerMorph(player,player,0,false);
    if (!bVar3) {
      return (char *)"";
    }
    if ((pPVar2 == morphclass || quickundo) ||
       (bVar3 = P_MorphPlayer(player,player,morphclass,0,iVar4,(PClassActor *)0x0,(PClassActor *)0x0
                             ), !bVar3)) {
      pcVar5 = "TXT_NOTSTRANGE";
    }
    else {
      pcVar5 = "TXT_STRANGER";
    }
  }
  pcVar5 = FStringTable::operator()(&GStrings,pcVar5);
  return pcVar5;
}

Assistant:

const char *cht_Morph (player_t *player, PClassPlayerPawn *morphclass, bool quickundo)
{
	if (player->mo == NULL)
	{
		return "";
	}
	PClassPlayerPawn *oldclass = player->mo->GetClass();

	// Set the standard morph style for the current game
	int style = MORPH_UNDOBYTOMEOFPOWER;
	if (gameinfo.gametype == GAME_Hexen) style |= MORPH_UNDOBYCHAOSDEVICE;

	if (player->morphTics)
	{
		if (P_UndoPlayerMorph (player, player))
		{
			if (!quickundo && oldclass != morphclass && P_MorphPlayer (player, player, morphclass, 0, style))
			{
				return GStrings("TXT_STRANGER");
			}
			return GStrings("TXT_NOTSTRANGE");
		}
	}
	else if (P_MorphPlayer (player, player, morphclass, 0, style))
	{
		return GStrings("TXT_STRANGE");
	}
	return "";
}